

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

size_t json_object_get_cell_ix
                 (JSON_Object *object,char *key,size_t key_len,unsigned_long hash,
                 parson_bool_t *out_found)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  char *__s;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar2 = object->cell_capacity;
  uVar1 = uVar2 - 1;
  *out_found = 0;
  uVar7 = 0;
  while( true ) {
    if (uVar2 <= uVar7) {
      return 0xffffffffffffffff;
    }
    uVar6 = (uVar1 & hash) + (ulong)uVar7 & uVar1;
    sVar3 = object->cells[uVar6];
    if (sVar3 == 0xffffffffffffffff) break;
    if (object->hashes[sVar3] == hash) {
      __s = object->names[sVar3];
      sVar5 = strlen(__s);
      if ((sVar5 == key_len) && (iVar4 = strncmp(key,__s,key_len), iVar4 == 0)) {
        *out_found = 1;
        return uVar6;
      }
    }
    uVar7 = uVar7 + 1;
  }
  return uVar6;
}

Assistant:

static size_t json_object_get_cell_ix(const JSON_Object *object, const char *key, size_t key_len, unsigned long hash, parson_bool_t *out_found) {
    size_t cell_ix = hash & (object->cell_capacity - 1);
    size_t cell = 0;
    size_t ix = 0;
    unsigned int i = 0;
    unsigned long hash_to_check = 0;
    const char *key_to_check = NULL;
    size_t key_to_check_len = 0;

    *out_found = PARSON_FALSE;

    for (i = 0; i < object->cell_capacity; i++) {
        ix = (cell_ix + i) & (object->cell_capacity - 1);
        cell = object->cells[ix];
        if (cell == OBJECT_INVALID_IX) {
            return ix;
        }
        hash_to_check = object->hashes[cell];
        if (hash != hash_to_check) {
            continue;
        }
        key_to_check = object->names[cell];
        key_to_check_len = strlen(key_to_check);
        if (key_to_check_len == key_len && strncmp(key, key_to_check, key_len) == 0) {
            *out_found = PARSON_TRUE;
            return ix;
        }
    }
    return OBJECT_INVALID_IX;
}